

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool QMainWindowLayout::needsPlatformDrag(void)

{
  byte bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  undefined1 in_stack_ffffffffffffffd0 [16];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (needsPlatformDrag()::wayland == '\0') {
    iVar2 = __cxa_guard_acquire(&needsPlatformDrag()::wayland);
    if (iVar2 != 0) {
      QGuiApplication::platformName();
      QVar3 = Qt::Literals::StringLiterals::operator____L1
                        (in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
      bVar1 = QString::startsWith((QLatin1String *)local_20,(CaseSensitivity)QVar3.m_size);
      QString::~QString((QString *)0x5fdd89);
      needsPlatformDrag::wayland = (bool)(bVar1 & 1);
      __cxa_guard_release(&needsPlatformDrag()::wayland);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(needsPlatformDrag::wayland & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayout::needsPlatformDrag()
{
    static const bool wayland =
            QGuiApplication::platformName().startsWith("wayland"_L1, Qt::CaseInsensitive);
    return wayland;
}